

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O2

SQInteger array_remove(HSQUIRRELVM v)

{
  SQObjectType SVar1;
  bool bVar2;
  SQObjectPtr *pSVar3;
  SQObjectPtr *pSVar4;
  SQRESULT SVar5;
  SQInteger SVar6;
  SQObjectPtr val;
  
  SVar5 = 1;
  pSVar3 = stack_get(v,1);
  pSVar4 = stack_get(v,2);
  SVar1 = (pSVar4->super_SQObject)._type;
  if ((SVar1 >> 0x1a & 1) == 0) {
    SVar5 = sq_throwerror(v,"wrong type");
    return SVar5;
  }
  val.super_SQObject._type = OT_NULL;
  val.super_SQObject._unVal.pTable = (SQTable *)0x0;
  if (SVar1 == OT_FLOAT) {
    SVar6 = (SQInteger)(pSVar4->super_SQObject)._unVal.fFloat;
  }
  else {
    SVar6 = (pSVar4->super_SQObject)._unVal.nInteger;
  }
  bVar2 = SQArray::Get((pSVar3->super_SQObject)._unVal.pArray,SVar6,&val);
  if (bVar2) {
    if ((pSVar4->super_SQObject)._type == OT_FLOAT) {
      SVar6 = (SQInteger)(pSVar4->super_SQObject)._unVal.fFloat;
    }
    else {
      SVar6 = (pSVar4->super_SQObject)._unVal.nInteger;
    }
    SQArray::Remove((pSVar3->super_SQObject)._unVal.pArray,SVar6);
    SQVM::Push(v,&val);
  }
  else {
    SVar5 = sq_throwerror(v,"idx out of range");
  }
  SQObjectPtr::~SQObjectPtr(&val);
  return SVar5;
}

Assistant:

static SQInteger array_remove(HSQUIRRELVM v)
{
    SQObject &o = stack_get(v, 1);
    SQObject &idx = stack_get(v, 2);
    if(!sq_isnumeric(idx)) return sq_throwerror(v, _SC("wrong type"));
    SQObjectPtr val;
    if(_array(o)->Get(tointeger(idx), val)) {
        _array(o)->Remove(tointeger(idx));
        v->Push(val);
        return 1;
    }
    return sq_throwerror(v, _SC("idx out of range"));
}